

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

string_type * __thiscall
booster::locale::basic_format<wchar_t>::str_abi_cxx11_
          (string_type *__return_storage_ptr__,basic_format<wchar_t> *this,locale *loc)

{
  size_t in_RCX;
  void *__buf;
  wostringstream local_1a8 [8];
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> buffer;
  locale local_30 [8];
  
  std::__cxx11::wostringstream::wostringstream(local_1a8);
  std::wios::imbue(local_30);
  std::locale::~locale(local_30);
  write(this,(int)local_1a8,__buf,in_RCX);
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wostringstream::~wostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string_type str(std::locale const &loc = std::locale()) const
            {
                std::basic_ostringstream<CharType> buffer;
                buffer.imbue(loc);
                write(buffer);
                return buffer.str();
            }